

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_insertADynArray_success_middleIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  void *_ck_x;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray destArray;
  
  destArray.buffer = (char *)0x0;
  destArray.reallocator._0_4_ = 0x10a480;
  destArray.reallocator._4_4_ = 0;
  destArray.deallocator._0_4_ = 0x10a4c0;
  destArray.deallocator._4_4_ = 0;
  destArray.size = 5;
  destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  destArray.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x111fe3;
  destArray.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(destArray.buffer,"0156",5);
  uStack_50 = 0x111ffc;
  pcVar3 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(pcVar3,"234",4);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x11202b;
  bVar1 = private_ACUtils_ADynArray_insertArray(&destArray,2,pcVar3,3,1);
  if (bVar1 == true) {
    uStack_50 = 0x112045;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x3e1);
    if (destArray.size == 8) {
      uStack_50 = 0x112065;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x3e2);
      if (destArray.capacity == 8) {
        uStack_50 = 0x112085;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x3e3);
        if (destArray.buffer == (char *)0x0) {
          ppcVar7 = &local_58;
          pcVar5 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) destArray.buffer != NULL";
          pcVar9 = "(void*) destArray.buffer";
          iVar2 = 0x3e4;
          goto LAB_001123a9;
        }
        uStack_50 = 0x1120a2;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x3e4);
        pcStack_80 = destArray.buffer;
        if (destArray.buffer == (char *)0x0) {
          pcVar5 = "";
          pcStack_80 = "(null)";
        }
        else {
          uStack_50 = 0x1120bf;
          iVar2 = strcmp("0123456",destArray.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x1120d8;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x3e5);
            if (destArray.growStrategy == (ACUtilsGrowStrategy)0x0) {
              ppcVar7 = &local_58;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) destArray.growStrategy != NULL";
              pcVar9 = "(void*) destArray.growStrategy";
              iVar2 = 0x3e6;
LAB_001123a9:
              uStack_50 = 0;
              local_58 = (char *)0x0;
              *(code **)((long)ppcVar7 + -8) = test_ADynArray_insertADynArray_success_endIndex_fn;
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                                ,iVar2,pcVar5,pcVar3,pcVar8,pcVar9);
            }
            uStack_50 = 0x1120f8;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x3e6);
            uStack_50 = 0x112105;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,999);
            uStack_50 = 0x112112;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,1000);
            uStack_50 = 0x11211f;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x3e9);
            uStack_50 = 0x112131;
            iVar2 = strcmp("234",pcVar3);
            if (iVar2 == 0) {
              uStack_50 = 0x11214d;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x3ea);
              uStack_50 = 0x11215a;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x3eb);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_50 = 0x11217b;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x3ec);
                uStack_50 = 0x112184;
                (*(code *)CONCAT44(destArray.deallocator._4_4_,destArray.deallocator._0_4_))
                          (destArray.buffer);
                private_ACUtilsTest_ADynArray_freeCount =
                     private_ACUtilsTest_ADynArray_freeCount + 1;
                uStack_50 = 0x112193;
                free(pcVar3);
                return;
              }
              ppcVar7 = &local_68;
              local_60 = "0";
              local_68 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar9 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x3ec;
              goto LAB_001123a9;
            }
            pcVar5 = "\"";
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar8 = "srcArray.buffer == \"234\"";
            pcVar9 = "srcArray.buffer";
            iVar2 = 0x3ea;
            local_58 = "\"";
            local_60 = "234";
            local_68 = "\"";
            pcStack_70 = "\"234\"";
            pcStack_78 = "\"";
            ppcVar6 = &pcStack_80;
            pcStack_80 = pcVar3;
            goto LAB_0011235e;
          }
          pcVar5 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar8 = "destArray.buffer == \"0123456\"";
        pcVar9 = "destArray.buffer";
        iVar2 = 0x3e5;
        local_58 = "\"";
        local_60 = "0123456";
        local_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppcVar6 = &pcStack_80;
        pcStack_78 = pcVar5;
        goto LAB_0011235e;
      }
      pcVar8 = "destArray.capacity == 8";
      pcVar9 = "destArray.capacity";
      iVar2 = 0x3e3;
      pcVar5 = (char *)destArray.capacity;
    }
    else {
      pcVar8 = "destArray.size == 8";
      pcVar9 = "destArray.size";
      iVar2 = 0x3e2;
      pcVar5 = (char *)destArray.size;
    }
    local_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar5 = (char *)(ulong)bVar1;
    local_60 = "true";
    pcVar8 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, 2, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
    ;
    pcVar9 = 
    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, 2, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
    ;
    iVar2 = 0x3e1;
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar6 = &local_60;
LAB_0011235e:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x112365;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar4,pcVar8,pcVar9);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertADynArray_success_middleIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "0156", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "234\0", 4);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertADynArray(&destArray, 2, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}